

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmFMove<(moira::Instr)192,(moira::Mode)5,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  int iVar2;
  Syntax SVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  char cVar7;
  char *pcVar8;
  Fp fp;
  Moira *this_00;
  Ffmt ffmt;
  uint ext;
  Ea<(moira::Mode)5,_4> result;
  u32 local_44;
  ushort local_40;
  uint local_3c;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  this_00 = this;
  uVar5 = (*this->_vptr_Moira[6])();
  ext = uVar5 & 0xffff;
  if (((str->style->syntax & ~MOIRA_MIT) == GNU) &&
     (bVar4 = isValidExtFPU(this_00,FMOVE,DI,op,ext), !bVar4)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)192,(moira::Mode)5,0>(this,str,addr,op);
    return;
  }
  local_40 = op & 7;
  ffmt.raw = ext >> 10 & 7;
  fp.raw = ext >> 7 & 7;
  if (ext >> 0xd == 3) {
    cVar7 = 'f';
    lVar6 = 1;
    if (ffmt.raw == 3) {
      do {
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = cVar7;
        cVar7 = "fmove"[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 6);
      StrWriter::operator<<(str,(Ffmt)0x3);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = ' ';
      }
      else {
        iVar2 = (str->tab).raw;
        pcVar8 = str->ptr;
        do {
          str->ptr = pcVar8 + 1;
          *pcVar8 = ' ';
          pcVar8 = str->ptr;
        } while (pcVar8 < str->base + iVar2);
      }
      StrWriter::operator<<(str,fp);
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = ',';
      SVar3 = str->style->syntax;
      if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = ' ';
      }
      local_44 = *addr;
      *addr = local_44 + 2;
      local_3c = (*this->_vptr_Moira[6])();
      local_3c = local_3c & 0xffff;
      StrWriter::operator<<(str,(Ea<(moira::Mode)5,_4> *)&local_44);
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = '{';
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = '#';
      StrWriter::operator<<(str,(Int)((int)(ext << 0x19) >> 0x19));
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = '}';
    }
    else if (ffmt.raw == 7) {
      do {
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = cVar7;
        cVar7 = "fmove"[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 6);
      StrWriter::operator<<(str,(Ffmt)0x3);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = ' ';
      }
      else {
        iVar2 = (str->tab).raw;
        pcVar8 = str->ptr;
        do {
          str->ptr = pcVar8 + 1;
          *pcVar8 = ' ';
          pcVar8 = str->ptr;
        } while (pcVar8 < str->base + iVar2);
      }
      StrWriter::operator<<(str,fp);
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = ',';
      SVar3 = str->style->syntax;
      if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = ' ';
      }
      local_44 = *addr;
      *addr = local_44 + 2;
      local_3c = (*this->_vptr_Moira[6])();
      local_3c = local_3c & 0xffff;
      StrWriter::operator<<(str,(Ea<(moira::Mode)5,_4> *)&local_44);
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = ',';
      SVar3 = str->style->syntax;
      if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = ' ';
      }
      StrWriter::operator<<(str,(Dn)(ext >> 4 & 7));
    }
    else {
      do {
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = cVar7;
        cVar7 = "fmove"[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 6);
      StrWriter::operator<<(str,ffmt);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = ' ';
      }
      else {
        iVar2 = (str->tab).raw;
        pcVar8 = str->ptr;
        do {
          str->ptr = pcVar8 + 1;
          *pcVar8 = ' ';
          pcVar8 = str->ptr;
        } while (pcVar8 < str->base + iVar2);
      }
      StrWriter::operator<<(str,fp);
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = ',';
      SVar3 = str->style->syntax;
      if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = ' ';
      }
      local_44 = *addr;
      *addr = local_44 + 2;
      local_3c = (*this->_vptr_Moira[6])(this);
      local_3c = local_3c & 0xffff;
      StrWriter::operator<<(str,(Ea<(moira::Mode)5,_4> *)&local_44);
    }
  }
  else {
    uVar5 = uVar5 & 0x7f;
    if (ext >> 0xd == 2) {
      cVar7 = 'f';
      lVar6 = 1;
      if (uVar5 == 0x40) {
        do {
          pcVar8 = str->ptr;
          str->ptr = pcVar8 + 1;
          *pcVar8 = cVar7;
          cVar7 = "fsmove"[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 7);
      }
      else if (uVar5 == 0x44) {
        do {
          pcVar8 = str->ptr;
          str->ptr = pcVar8 + 1;
          *pcVar8 = cVar7;
          cVar7 = "fdmove"[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 7);
      }
      else {
        do {
          pcVar8 = str->ptr;
          str->ptr = pcVar8 + 1;
          *pcVar8 = cVar7;
          cVar7 = "fmove"[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 6);
      }
      StrWriter::operator<<(str,ffmt);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = ' ';
      }
      else {
        iVar2 = (str->tab).raw;
        pcVar8 = str->ptr;
        do {
          str->ptr = pcVar8 + 1;
          *pcVar8 = ' ';
          pcVar8 = str->ptr;
        } while (pcVar8 < str->base + iVar2);
      }
      local_44 = *addr;
      *addr = local_44 + 2;
      local_3c = (*this->_vptr_Moira[6])(this);
      local_3c = local_3c & 0xffff;
      StrWriter::operator<<(str,(Ea<(moira::Mode)5,_4> *)&local_44);
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = ',';
      SVar3 = str->style->syntax;
      if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = ' ';
      }
      StrWriter::operator<<(str,fp);
    }
    else if (ext >> 0xd == 0) {
      cVar7 = 'f';
      lVar6 = 1;
      if (uVar5 == 0x40) {
        do {
          pcVar8 = str->ptr;
          str->ptr = pcVar8 + 1;
          *pcVar8 = cVar7;
          cVar7 = "fsmove"[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 7);
      }
      else if (uVar5 == 0x44) {
        do {
          pcVar8 = str->ptr;
          str->ptr = pcVar8 + 1;
          *pcVar8 = cVar7;
          cVar7 = "fdmove"[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 7);
      }
      else {
        do {
          pcVar8 = str->ptr;
          str->ptr = pcVar8 + 1;
          *pcVar8 = cVar7;
          cVar7 = "fmove"[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 6);
      }
      StrWriter::operator<<(str,(Ffmt)0x2);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = ' ';
      }
      else {
        iVar2 = (str->tab).raw;
        pcVar8 = str->ptr;
        do {
          str->ptr = pcVar8 + 1;
          *pcVar8 = ' ';
          pcVar8 = str->ptr;
        } while (pcVar8 < str->base + iVar2);
      }
      StrWriter::operator<<(str,(Fp)ffmt.raw);
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = ',';
      SVar3 = str->style->syntax;
      if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = ' ';
      }
      StrWriter::operator<<(str,fp);
      return;
    }
  }
  return;
}

Assistant:

void
Moira::dasmFMove(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead(addr);
    auto reg = _____________xxx (op);
    auto cod = xxx_____________ (ext);
    auto src = ___xxx__________ (ext);
    auto dst = ______xxx_______ (ext);
    auto fac = _________xxxxxxx (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtFPU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    switch (cod) {

        case 0b000:

            if (fac == 0x40) str << Ins<Instr::FSMOVE>{} << Ffmt{2};
            else if (fac == 0x44) str << Ins<Instr::FDMOVE>{} << Ffmt{2};
            else str << Ins<I>{} << Ffmt{2};

            str << str.tab << Fp(src) << Sep{} << Fp(dst);
            break;

        case 0b010:

            if (fac == 0x40) str << Ins<Instr::FSMOVE>{} << Ffmt{src};
            else if (fac == 0x44) str << Ins<Instr::FDMOVE>{} << Ffmt{src};
            else str << Ins<I>{} << Ffmt{src};

            if (M == Mode::IM) {

                u64 val;

                switch (src) {

                    case 0: // Long-Word Integer
                        val = dasmIncRead<Long>(addr);
                        str << str.tab << Ims<Long>(u32(val)) << Sep{} << Fp(dst);
                        break;

                    case 1: // Single precision

                        val = dasmIncRead<Long>(addr);
                        str << str.tab << "#<fixme>" << Sep{} << Fp(dst);
                        break;

                    case 2: // Double precision
                    case 3: // Packed-Decimal Real

                        val = dasmIncRead<Long>(addr);
                        dasmIncRead<Long>(addr);
                        dasmIncRead<Long>(addr); // Why???
                        str << str.tab << "#<fixme>" << Sep{} << Fp(dst);
                        break;

                    case 5: // Double-precision real

                        val = dasmIncRead<Long>(addr);
                        dasmIncRead<Long>(addr);
                        str << str.tab << "#<fixme>" << Sep{} << Fp(dst);
                        break;

                    case 6: // Byte Integer
                        val = dasmIncRead<Word>(addr);
                        str << str.tab << Ims<Byte>(u32(val)) << Sep{} << Fp(dst);
                        break;

                    default:
                        str << str.tab << Op<M, Word>(reg, addr) << Sep{} << Fp(dst);
                }
            } else {
                str << str.tab << Op<M, Long>(reg, addr) << Sep{} << Fp(dst);
            }
            break;

        case 0b011:

            switch (src) {

                case 0b011:

                    str << Ins<I>{} << Ffmt{src} << str.tab << Fp(dst) << Sep{} << Op<M, Long>(reg, addr);
                    str << "{" << Ims<Byte>(i8(fac << 1) >> 1) << "}";
                    break;

                case 0b111:

                    str << Ins<I>{} << Ffmt{3} << str.tab << Fp{dst} << Sep{} << Op<M, Long>(reg, addr);
                    str << Sep{} << Dn(fac >> 4);
                    break;

                default:

                    str << Ins<I>{} << Ffmt{src} << str.tab << Fp{dst} << Sep{} << Op<M, Long>(reg, addr);
                    break;
            }
            break;
    }
}